

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

optional<AddressPosition> * __thiscall
AddrManImpl::FindAddressEntry_(AddrManImpl *this,CAddress *addr)

{
  long lVar1;
  int iVar2;
  int multiplicity_in;
  AddrInfo *pAVar3;
  CService *in_RSI;
  AddrInfo *in_RDI;
  long in_FS_OFFSET;
  int in_stack_0000000c;
  NetGroupManager *in_stack_00000010;
  uint256 *in_stack_00000018;
  AddrInfo *in_stack_00000020;
  int bucket_1;
  int bucket;
  AddrInfo *addr_info;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  int in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  AddrInfo *pnId;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffdf;
  uint256 *in_stack_ffffffffffffffe0;
  AddrInfo *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pnId = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_RDI,(char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c,(AnnotatedMixin<std::mutex> *)0x88226c);
  pAVar3 = Find((AddrManImpl *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_RSI,
                (nid_type *)pnId);
  if (pAVar3 == (AddrInfo *)0x0) {
    std::optional<AddressPosition>::optional((optional<AddressPosition> *)in_RDI);
  }
  else if ((pAVar3->fInTried & 1U) == 0) {
    multiplicity_in =
         AddrInfo::GetNewBucket
                   (in_RDI,(uint256 *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                    (NetGroupManager *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                   );
    iVar2 = pAVar3->nRefCount;
    AddrInfo::GetBucketPosition
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
               in_stack_0000000c);
    AddressPosition::AddressPosition
              ((AddressPosition *)in_RDI,SUB41((uint)in_stack_ffffffffffffff94 >> 0x18,0),
               multiplicity_in,iVar2,in_stack_ffffffffffffff88);
    std::optional<AddressPosition>::optional<AddressPosition,_true>
              ((optional<AddressPosition> *)in_RDI,
               (AddressPosition *)CONCAT44(in_stack_ffffffffffffff94,multiplicity_in));
  }
  else {
    iVar2 = AddrInfo::GetTriedBucket(in_stack_00000020,in_stack_00000018,in_stack_00000010);
    AddrInfo::GetBucketPosition
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
               in_stack_0000000c);
    AddressPosition::AddressPosition
              ((AddressPosition *)in_RDI,SUB41((uint)iVar2 >> 0x18,0),in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
    std::optional<AddressPosition>::optional<AddressPosition,_true>
              ((optional<AddressPosition> *)in_RDI,
               (AddressPosition *)CONCAT44(iVar2,in_stack_ffffffffffffff90));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<AddressPosition> *)pnId;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<AddressPosition> AddrManImpl::FindAddressEntry_(const CAddress& addr)
{
    AssertLockHeld(cs);

    AddrInfo* addr_info = Find(addr);

    if (!addr_info) return std::nullopt;

    if(addr_info->fInTried) {
        int bucket{addr_info->GetTriedBucket(nKey, m_netgroupman)};
        return AddressPosition(/*tried_in=*/true,
                               /*multiplicity_in=*/1,
                               /*bucket_in=*/bucket,
                               /*position_in=*/addr_info->GetBucketPosition(nKey, false, bucket));
    } else {
        int bucket{addr_info->GetNewBucket(nKey, m_netgroupman)};
        return AddressPosition(/*tried_in=*/false,
                               /*multiplicity_in=*/addr_info->nRefCount,
                               /*bucket_in=*/bucket,
                               /*position_in=*/addr_info->GetBucketPosition(nKey, true, bucket));
    }
}